

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O2

bool __thiscall pg::PTLSolver::search(PTLSolver *this,bitset *R,int top,int player)

{
  uint __val;
  int iVar1;
  uint v;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  size_t pos;
  Game *pGVar5;
  bool bVar6;
  int *piVar7;
  long lVar8;
  uint player_00;
  uint vertex;
  ulong uVar9;
  ulong uVar10;
  string local_70;
  bitset Z;
  
  bitset::bitset(&Z,((this->super_Solver).game)->n_vertices);
  uVar9 = (ulong)top;
  bVar6 = false;
  do {
    if (uVar9 == 0xffffffffffffffff) {
      bitset::~bitset(&Z);
      return bVar6;
    }
    if ((R->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
      __val = ((this->super_Solver).game)->_priority[uVar9];
      Z._bits[uVar9 >> 6] = Z._bits[uVar9 >> 6] | 1L << (uVar9 & 0x3f);
      player_00 = __val & 1;
      this->str[uVar9] = -1;
      iVar1 = (this->Q).pointer;
      (this->Q).pointer = iVar1 + 1;
      vertex = (uint)uVar9;
      (this->Q).queue[iVar1] = vertex;
      while( true ) {
        iVar1 = (this->Q).pointer;
        if ((long)iVar1 == 0) break;
        (this->Q).pointer = iVar1 + -1;
        v = (this->Q).queue[(long)iVar1 + -1];
        attractVertices(this,player_00,v,R,&Z,R);
        if ((player_00 ^ player) != 1) {
          attractTangles(this,player_00,v,R,&Z,R);
        }
      }
      if (1 < (this->super_Solver).trace) {
        poVar4 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m \x1b[1;36m");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,__val);
        std::operator<<(poVar4,"\x1b[m");
        for (pos = bitset::find_first(&Z); poVar4 = (this->super_Solver).logger,
            pos != 0xffffffffffffffff; pos = bitset::find_next(&Z,pos)) {
          poVar4 = std::operator<<(poVar4," \x1b[1;38;5;15m");
          local_70._M_dataplus._M_p = (pointer)(this->super_Solver).game;
          local_70._M_string_length._0_4_ = (int)pos;
          poVar4 = operator<<(poVar4,(_label_vertex *)&local_70);
          std::operator<<(poVar4,"\x1b[m");
          if (this->str[pos] != -1) {
            poVar4 = std::operator<<((this->super_Solver).logger,"->");
            local_70._M_dataplus._M_p = (pointer)(this->super_Solver).game;
            local_70._M_string_length._0_4_ = this->str[pos];
            operator<<(poVar4,(_label_vertex *)&local_70);
          }
        }
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      if ((player == -1) || (player_00 == player)) {
        uVar3 = Solver::owner(&this->super_Solver,vertex);
        if (uVar3 == player_00) {
          if (this->str[uVar9] != -1) {
            pGVar5 = (this->super_Solver).game;
            goto LAB_00161426;
          }
LAB_001614b2:
          std::__cxx11::to_string(&local_70,__val);
          std::__cxx11::string::operator=((string *)&this->path,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          bVar2 = search_rec(this,&Z,vertex,player_00,R);
        }
        else {
          pGVar5 = (this->super_Solver).game;
          for (piVar7 = pGVar5->_outedges + pGVar5->_firstouts[uVar9]; uVar10 = (ulong)*piVar7,
              uVar10 != 0xffffffffffffffff; piVar7 = piVar7 + 1) {
            if (((Z._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) &&
               ((R->_bits[uVar10 >> 6] & 1L << (uVar10 & 0x3f)) != 0)) goto LAB_001614b2;
          }
LAB_00161426:
          memset(this->pea_vidx,0,pGVar5->n_vertices << 2);
          this->pea_curidx = 1;
          bVar2 = extractTangles(this,vertex,&Z,this->str);
        }
        bVar6 = (bool)(bVar6 | bVar2);
      }
      bitset::operator-=(R,&Z);
      for (lVar8 = 0; Z._bitssize << 3 != lVar8; lVar8 = lVar8 + 8) {
        *(undefined8 *)((long)Z._bits + lVar8) = 0;
      }
    }
    uVar9 = uVar9 - 1;
  } while( true );
}

Assistant:

bool
PTLSolver::search(bitset &R, int top, int player)
{
    bool changes = false;

    bitset Z(nodecount());

    // Partition the game <R>

    for (; top!=-1; top--) {
        // find next top
        if (!R[top]) continue;

        const int pr = priority(top);
        const int pl = priority(top)&1;

        Z[top] = true; // add to <Z>
        str[top] = -1;
        Q.push(top);

        while (Q.nonempty()) {
            const int v = Q.pop();
            /*/ R[v] = false; // remove from <R> */
            attractVertices(pl, v, R, Z, R);
            // attract tangles if correct player, or <player> equals -1
            if ((1-pl) != player) attractTangles(pl, v, R, Z, R);
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m \033[1;36m" << pr << "\033[m";
            for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
        }
#endif

        if (player == -1 or pl == player) {
            /**
             * Now Z is the current region and <top> the top vertex
             */

            bool closed_region = true;

            /**
             * Check if Z is locally closed by looking at <top>.
             */

            if (owner(top) == pl) {
                if (str[top] == -1) closed_region = false;
            } else {
                for (auto curedge = outs(top); *curedge != -1; curedge++) {
                    if (!Z[*curedge] and R[*curedge]) {
                        closed_region = false;
                        break;
                    }
                }
            }

            if (closed_region) {
                /**
                 * Extract tangles by computing SCCs starting at each top vertex.
                 * Note: each bottom SCC must contain a head vertex.
                 */

                memset(pea_vidx, 0, sizeof(int[nodecount()]));
                pea_curidx = 1;
                changes |= extractTangles(top, Z, str);
            } else {
                /**
                 * Not a closed region, go recursive.
                 */

               // initialize path (for trace output) to <pr>
               path = std::to_string(pr);
               changes |= search_rec(Z, top, pl, R);
            }
        }

        R -= Z;
        Z.reset();
    }

    return changes;
}